

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QCss::BasicSelector>::moveAppend
          (QGenericArrayOps<QCss::BasicSelector> *this,BasicSelector *b,BasicSelector *e)

{
  BasicSelector *this_00;
  ulong in_RDX;
  ulong in_RSI;
  BasicSelector *in_RDI;
  BasicSelector *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QCss::BasicSelector>::begin
                        ((QArrayDataPointer<QCss::BasicSelector> *)0xa58bf7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QCss::BasicSelector::BasicSelector(this_00,in_RDI);
      local_10 = local_10 + 0x68;
      (in_RDI->elementName).d.size = (in_RDI->elementName).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }